

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator_target.hpp
# Opt level: O2

bool __thiscall
ruckig::TargetCalculator<3UL,_ruckig::StandardVector>::synchronize
          (TargetCalculator<3UL,_ruckig::StandardVector> *this,optional<double> t_min,double *t_sync
          ,optional<unsigned_long> *limiting_dof,Vector<Profile> *profiles,bool discrete_duration,
          double delta_time)

{
  StandardVector<Block,_3UL> *pSVar1;
  char cVar2;
  size_t sVar3;
  ulong __denom;
  optional<ruckig::Block::Interval> *poVar4;
  bool bVar5;
  unsigned_long *puVar6;
  long lVar7;
  unsigned_long uVar8;
  long lVar9;
  Block *pBVar10;
  StandardVector<Block,_3UL> *__last;
  long lVar11;
  size_t sVar12;
  byte bVar13;
  unsigned_long *puVar15;
  size_t dof;
  ulong uVar16;
  _Storage<double,_true> _Var17;
  double dVar18;
  undefined8 uVar19;
  ldiv_t lVar20;
  _Storage<double,_true> local_40;
  byte bVar14;
  
  local_40 = t_min.super__Optional_base<double,_true,_true>._M_payload.
             super__Optional_payload_base<double>._M_payload;
  sVar3 = this->degrees_of_freedom;
  pSVar1 = &this->blocks;
  lVar7 = sVar3 + 6;
  lVar9 = sVar3 * 0x10 + 0x30;
  lVar11 = 0x188;
  bVar13 = 0;
  for (sVar12 = 0; sVar3 != sVar12; sVar12 = sVar12 + 1) {
    if ((this->inp_per_dof_synchronization)._M_elems[sVar12] == None) {
      (this->possible_t_syncs)._M_elems[sVar12] = 0.0;
      (this->new_phase_control)._M_elems[lVar7] = INFINITY;
      *(undefined8 *)((long)(this->new_phase_control)._M_elems + lVar9) = 0x7ff0000000000000;
    }
    else {
      (this->possible_t_syncs)._M_elems[sVar12] =
           *(double *)((long)(this->new_phase_control)._M_elems + lVar11 * 2);
      cVar2 = *(char *)((long)(this->blocks)._M_elems[0].p_min.brake.j._M_elems + lVar11 * 2 + 8);
      dVar18 = INFINITY;
      if (cVar2 == '\x01') {
        dVar18 = *(double *)((long)(this->pd)._M_elems + lVar11 * 2 + -8);
      }
      (this->new_phase_control)._M_elems[lVar7] = dVar18;
      bVar14 = *(byte *)((long)&(this->blocks)._M_elems[0].a.
                                super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload
                                .super__Optional_payload_base<ruckig::Block::Interval>._M_payload +
                        lVar11 * 2 + 0x198);
      uVar19 = 0x7ff0000000000000;
      if (bVar14 == 1) {
        uVar19 = *(undefined8 *)
                  ((long)(this->blocks)._M_elems[0].p_min.brake.a._M_elems + lVar11 * 2 + 8);
      }
      *(undefined8 *)((long)(this->new_phase_control)._M_elems + lVar9) = uVar19;
      if (cVar2 != '\0') {
        bVar14 = 1;
      }
      bVar13 = bVar14 | bVar13;
    }
    lVar11 = lVar11 + 0x37c;
    lVar7 = lVar7 + 1;
    lVar9 = lVar9 + 8;
  }
  _Var17 = local_40;
  if (((undefined1  [16])
       t_min.super__Optional_base<double,_true,_true>._M_payload.
       super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    _Var17._M_value = INFINITY;
  }
  ((_Storage<double,_true> *)((this->possible_t_syncs)._M_elems + sVar3 * 3))->_M_value =
       (double)_Var17;
  if (discrete_duration) {
    for (lVar7 = 0x30; lVar7 != 0x80; lVar7 = lVar7 + 8) {
      dVar18 = *(double *)((long)(this->new_phase_control)._M_elems + lVar7);
      if (ABS(dVar18) != INFINITY) {
        dVar18 = fmod(dVar18,delta_time);
        if (2.220446049250313e-16 < dVar18) {
          *(double *)((long)(this->new_phase_control)._M_elems + lVar7) =
               (delta_time - dVar18) + *(double *)((long)(this->new_phase_control)._M_elems + lVar7)
          ;
        }
      }
    }
  }
  __last = (StandardVector<Block,_3UL> *)((this->idx)._M_elems + this->degrees_of_freedom);
  if (((bVar13 | t_min.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_engaged) & 1) != 0) {
    __last = pSVar1;
  }
  uVar8 = 0;
  for (lVar7 = 0x80;
      (StandardVector<Block,_3UL> *)((long)(this->new_phase_control)._M_elems + lVar7) != __last;
      lVar7 = lVar7 + 8) {
    (this->idx)._M_elems[uVar8] = uVar8;
    uVar8 = uVar8 + 1;
  }
  std::
  __sort<unsigned_long*,__gnu_cxx::__ops::_Iter_comp_iter<ruckig::TargetCalculator<3ul,ruckig::StandardVector>::synchronize(std::optional<double>,double&,std::optional<unsigned_long>&,std::array<ruckig::Profile,3ul>&,bool,double)::_lambda(unsigned_long,unsigned_long)_1_>>
            ((this->idx)._M_elems,(unsigned_long *)__last,
             (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pantor[P]ruckig_include_ruckig_calculator_target_hpp:161:41)>
              )this);
  if (((undefined1  [16])
       t_min.super__Optional_base<double,_true,_true>._M_payload.
       super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_40._M_value = 0.0;
  }
  puVar15 = (this->idx)._M_elems + (this->degrees_of_freedom - 1);
  do {
    if ((StandardVector<Block,_3UL> *)puVar15 == __last) {
LAB_00118a57:
      return (StandardVector<Block,_3UL> *)puVar15 != __last;
    }
    dVar18 = (this->possible_t_syncs)._M_elems[*puVar15];
    uVar16 = 0;
    pBVar10 = pSVar1->_M_elems;
    for (; __denom = this->degrees_of_freedom, uVar16 < __denom; uVar16 = uVar16 + 1) {
      if ((this->inp_per_dof_synchronization)._M_elems[uVar16] != None) {
        bVar5 = Block::is_blocked(pBVar10,dVar18);
        if (bVar5) goto LAB_00118946;
      }
      pBVar10 = pBVar10 + 1;
    }
    if (ABS(dVar18) != INFINITY && local_40._M_value <= dVar18) {
      *t_sync = dVar18;
      if (*puVar15 == __denom * 3) {
        if ((limiting_dof->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
            super__Optional_payload_base<unsigned_long>._M_engaged == true) {
          (limiting_dof->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged = false;
        }
        goto LAB_00118a57;
      }
      lVar20 = ldiv(*puVar15,__denom);
      lVar7 = lVar20.quot;
      if ((limiting_dof->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged == false) {
        (limiting_dof->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged = true;
      }
      (limiting_dof->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value = lVar20.rem;
      if (lVar7 == 2) {
        puVar6 = std::optional<unsigned_long>::value(limiting_dof);
        poVar4 = &pSVar1->_M_elems[*puVar6].b;
LAB_00118a33:
        pBVar10 = (Block *)((long)&(poVar4->
                                   super__Optional_base<ruckig::Block::Interval,_true,_true>).
                                   _M_payload.super__Optional_payload_base<ruckig::Block::Interval>
                           + 0x10);
        puVar6 = std::optional<unsigned_long>::value(limiting_dof);
        uVar8 = *puVar6;
      }
      else {
        if (lVar7 == 1) {
          puVar6 = std::optional<unsigned_long>::value(limiting_dof);
          poVar4 = &pSVar1->_M_elems[*puVar6].a;
          goto LAB_00118a33;
        }
        if (lVar7 != 0) goto LAB_00118a57;
        puVar6 = std::optional<unsigned_long>::value(limiting_dof);
        pBVar10 = pSVar1->_M_elems + *puVar6;
        puVar6 = std::optional<unsigned_long>::value(limiting_dof);
        uVar8 = *puVar6;
      }
      memcpy(profiles->_M_elems + uVar8,pBVar10,0x23c);
      goto LAB_00118a57;
    }
LAB_00118946:
    puVar15 = puVar15 + 1;
  } while( true );
}

Assistant:

bool synchronize(std::optional<double> t_min, double& t_sync, std::optional<size_t>& limiting_dof, Vector<Profile>& profiles, bool discrete_duration, double delta_time) {
        // Check for (degrees_of_freedom == 1 && !t_min && !discrete_duration) is now outside

        // Possible t_syncs are the start times of the intervals and optional t_min
        bool any_interval {false};
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            // Ignore DoFs without synchronization here
            if (inp_per_dof_synchronization[dof] == Synchronization::None) {
                possible_t_syncs[dof] = 0.0;
                possible_t_syncs[degrees_of_freedom + dof] = std::numeric_limits<double>::infinity();
                possible_t_syncs[2 * degrees_of_freedom + dof] = std::numeric_limits<double>::infinity();
                continue;
            }

            possible_t_syncs[dof] = blocks[dof].t_min;
            possible_t_syncs[degrees_of_freedom + dof] = blocks[dof].a ? blocks[dof].a->right : std::numeric_limits<double>::infinity();
            possible_t_syncs[2 * degrees_of_freedom + dof] = blocks[dof].b ? blocks[dof].b->right : std::numeric_limits<double>::infinity();
            any_interval |= blocks[dof].a || blocks[dof].b;
        }
        possible_t_syncs[3 * degrees_of_freedom] = t_min.value_or(std::numeric_limits<double>::infinity());
        any_interval |= t_min.has_value();

        if (discrete_duration) {
            for (auto& possible_t_sync: possible_t_syncs) {
                if (std::isinf(possible_t_sync)) {
                    continue;
                }

                const double remainder = std::fmod(possible_t_sync, delta_time); // in [0, delta_time)
                if (remainder > eps) {
                    possible_t_sync += delta_time - remainder;
                }
            }
        }

        // Test them in sorted order
        auto idx_end = any_interval ? idx.end() : idx.begin() + degrees_of_freedom;
        std::iota(idx.begin(), idx_end, 0);
        std::sort(idx.begin(), idx_end, [&](size_t i, size_t j) { return possible_t_syncs[i] < possible_t_syncs[j]; });

        // Start at last tmin (or worse)
        for (auto i = idx.begin() + degrees_of_freedom - 1; i != idx_end; ++i) {
            const double possible_t_sync = possible_t_syncs[*i];
            bool is_blocked {false};
            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                if (inp_per_dof_synchronization[dof] == Synchronization::None) {
                    continue; // inner dof loop
                }
                if (blocks[dof].is_blocked(possible_t_sync)) {
                    is_blocked = true;
                    break; // inner dof loop
                }
            }
            if (is_blocked || possible_t_sync < t_min.value_or(0.0) || std::isinf(possible_t_sync)) {
                continue;
            }

            t_sync = possible_t_sync;
            if (*i == 3*degrees_of_freedom) { // Optional t_min
                limiting_dof = std::nullopt;
                return true;
            }

            const auto div = std::div(static_cast<long>(*i), static_cast<long>(degrees_of_freedom));
            limiting_dof = div.rem;
            switch (div.quot) {
                case 0: {
                    profiles[limiting_dof.value()] = blocks[limiting_dof.value()].p_min;
                } break;
                case 1: {
                    profiles[limiting_dof.value()] = blocks[limiting_dof.value()].a->profile;
                } break;
                case 2: {
                    profiles[limiting_dof.value()] = blocks[limiting_dof.value()].b->profile;
                } break;
            }
            return true;
        }

        return false;
    }